

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void funnelsort_Kway<64u,buffer_layout_bfs>(uchar **strings,size_t n)

{
  uchar **tmp_00;
  uchar **tmp;
  size_t n_local;
  uchar **strings_local;
  
  tmp_00 = (uchar **)malloc(n << 3);
  funnelsort<64u,buffer_layout_bfs>(strings,n,tmp_00);
  free(tmp_00);
  return;
}

Assistant:

void funnelsort_Kway(unsigned char** strings, size_t n)
{
	unsigned char** tmp = static_cast<unsigned char**>(
			malloc(n*sizeof(unsigned char*)));
	funnelsort<K, BufferLayout>(strings, n, tmp);
	free(tmp);
}